

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

golf_entity_t *
golf_entity_water(golf_entity_t *__return_storage_ptr__,char *name,golf_transform_t transform,
                 golf_geo_t geo,golf_lightmap_section_t lightmap_section)

{
  golf_entity_t *entity;
  char *name_local;
  
  __return_storage_ptr__->active = true;
  __return_storage_ptr__->parent_idx = -1;
  __return_storage_ptr__->type = WATER_ENTITY;
  snprintf(__return_storage_ptr__->name,0x40,"%s",name);
  memcpy((void *)((long)&__return_storage_ptr__->field_4 + 0x60),&transform,0x28);
  memcpy((void *)((long)&__return_storage_ptr__->field_4 + 0x88),&geo,0xe8);
  memcpy(&__return_storage_ptr__->field_4,&lightmap_section,0x60);
  return __return_storage_ptr__;
}

Assistant:

golf_entity_t golf_entity_water(const char *name, golf_transform_t transform, golf_geo_t geo, golf_lightmap_section_t lightmap_section) {
    golf_entity_t entity;
    entity.active = true;
    entity.parent_idx = -1;
    entity.type = WATER_ENTITY;
    snprintf(entity.name, GOLF_MAX_NAME_LEN, "%s", name);
    entity.water.transform = transform;
    entity.water.geo = geo;
    entity.water.lightmap_section = lightmap_section;
    return entity;
}